

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[62],kj::StringPtr,char_const(&)[92],kj::StringTree,char_const(&)[131],int,char_const(&)[152],kj::Array<kj::StringTree>,char_const(&)[61],kj::Array<kj::StringTree>,char_const(&)[49],kj::Array<kj::StringTree>,char_const(&)[2],kj::Array<kj::StringTree>,kj::String&,char_const(&)[2],kj::Array<kj::StringTree>,kj::String&,char_const(&)[2],kj::Array<kj::StringTree>,kj::Array<kj::StringTree>,char_const(&)[20]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [62],StringPtr *params_1,
          char (*params_2) [92],StringTree *params_3,char (*params_4) [131],int *params_5,
          char (*params_6) [152],Array<kj::StringTree> *params_7,char (*params_8) [61],
          Array<kj::StringTree> *params_9,char (*params_10) [49],Array<kj::StringTree> *params_11,
          char (*params_12) [2],Array<kj::StringTree> *params_13,String *params_14,
          char (*params_15) [2],Array<kj::StringTree> *params_16,String *params_17,
          char (*params_18) [2],Array<kj::StringTree> *params_19,Array<kj::StringTree> *params_20,
          char (*params_21) [20])

{
  char (*value) [62];
  StringPtr *value_00;
  char (*value_01) [92];
  StringTree *pSVar1;
  char (*value_02) [131];
  int *value_03;
  char (*value_04) [152];
  Array<kj::StringTree> *pAVar2;
  char (*value_05) [61];
  char (*value_06) [49];
  char (*pacVar3) [2];
  String *pSVar4;
  char (*value_07) [20];
  Array<kj::StringTree> *value_08;
  Array<kj::StringTree> *value_09;
  Array<kj::StringTree> *value_10;
  Array<kj::StringTree> *value_11;
  Array<kj::StringTree> *value_12;
  Array<kj::StringTree> *value_13;
  Array<kj::StringTree> *value_14;
  ArrayPtr<const_char> *in_stack_fffffffffffffca0;
  ArrayPtr<const_char> local_2b8;
  StringTree local_2a8;
  StringTree local_270;
  ArrayPtr<const_char> local_238;
  ArrayPtr<const_char> local_228;
  StringTree local_218;
  ArrayPtr<const_char> local_1e0;
  ArrayPtr<const_char> local_1d0;
  StringTree local_1c0;
  ArrayPtr<const_char> local_188;
  StringTree local_178;
  ArrayPtr<const_char> local_140;
  StringTree local_130;
  ArrayPtr<const_char> local_e8;
  StringTree local_d8;
  ArrayPtr<const_char> local_a0;
  CappedArray<char,_14UL> local_90;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringTree *local_38;
  char (*params_local_4) [131];
  StringTree *params_local_3;
  char (*params_local_2) [92];
  StringPtr *params_local_1;
  char (*params_local) [62];
  
  local_38 = params_3;
  params_local_4 = (char (*) [131])params_2;
  params_local_3 = (StringTree *)params_1;
  params_local_2 = (char (*) [92])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [62])__return_storage_ptr__;
  value = ::const((char (*) [62])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[62]>(value);
  value_00 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_2);
  local_58 = _::toStringTreeOrCharSequence<kj::StringPtr>(value_00);
  value_01 = ::const((char (*) [92])params_local_3);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[92]>(value_01);
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_4);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value_02 = ::const((char (*) [131])local_38);
  local_78 = _::toStringTreeOrCharSequence<char_const(&)[131]>(value_02);
  value_03 = fwd<int>((NoInfer<int> *)params_4);
  _::toStringTreeOrCharSequence<int>(&local_90,value_03);
  value_04 = ::const((char (*) [152])params_5);
  local_a0 = _::toStringTreeOrCharSequence<char_const(&)[152]>(value_04);
  pAVar2 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_6);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_d8,(_ *)pAVar2,value_08);
  value_05 = ::const((char (*) [61])params_7);
  local_e8 = _::toStringTreeOrCharSequence<char_const(&)[61]>(value_05);
  pAVar2 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_8);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_130,(_ *)pAVar2,value_09);
  value_06 = ::const((char (*) [49])params_9);
  local_140 = _::toStringTreeOrCharSequence<char_const(&)[49]>(value_06);
  pAVar2 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_10);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_178,(_ *)pAVar2,value_10);
  pacVar3 = ::const((char (*) [2])params_11);
  local_188 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar3);
  pAVar2 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_12);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_1c0,(_ *)pAVar2,value_11);
  pSVar4 = fwd<kj::String&>((String *)params_13);
  local_1d0 = _::toStringTreeOrCharSequence<kj::String&>(pSVar4);
  pacVar3 = ::const((char (*) [2])params_14);
  local_1e0 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar3);
  pAVar2 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_15);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_218,(_ *)pAVar2,value_12);
  pSVar4 = fwd<kj::String&>((String *)params_16);
  local_228 = _::toStringTreeOrCharSequence<kj::String&>(pSVar4);
  pacVar3 = ::const((char (*) [2])params_17);
  local_238 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar3);
  pAVar2 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_18);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_270,(_ *)pAVar2,value_13);
  pAVar2 = fwd<kj::Array<kj::StringTree>>(params_19);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_2a8,(_ *)pAVar2,value_14);
  value_07 = ::const((char (*) [20])params_20);
  local_2b8 = _::toStringTreeOrCharSequence<char_const(&)[20]>(value_07);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)pSVar1,(StringTree *)&local_78,
             (ArrayPtr<const_char> *)&local_90,(CappedArray<char,_14UL> *)&local_a0,
             (ArrayPtr<const_char> *)&local_d8,(StringTree *)&local_e8,
             (ArrayPtr<const_char> *)&local_130,(StringTree *)&local_140,
             (ArrayPtr<const_char> *)&local_178,(StringTree *)&local_188,
             (ArrayPtr<const_char> *)&local_1c0,(StringTree *)&local_1d0,&local_1e0,
             (ArrayPtr<const_char> *)&local_218,(StringTree *)&local_228,&local_238,
             (ArrayPtr<const_char> *)&local_270,&local_2a8,(StringTree *)&local_2b8,
             in_stack_fffffffffffffca0);
  StringTree::~StringTree(&local_2a8);
  StringTree::~StringTree(&local_270);
  StringTree::~StringTree(&local_218);
  StringTree::~StringTree(&local_1c0);
  StringTree::~StringTree(&local_178);
  StringTree::~StringTree(&local_130);
  StringTree::~StringTree(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}